

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O1

void __thiscall
spirv_cross::SmallVector<spvc_reflected_resource,_8UL>::reserve
          (SmallVector<spvc_reflected_resource,_8UL> *this,size_t count)

{
  undefined8 *puVar1;
  char *pcVar2;
  spvc_reflected_resource *psVar3;
  undefined8 uVar4;
  ulong uVar5;
  spvc_reflected_resource *psVar6;
  long lVar7;
  ulong uVar8;
  
  if (count < 0xaaaaaaaaaaaaaab) {
    uVar5 = this->buffer_capacity;
    if (uVar5 < count) {
      uVar8 = 8;
      if (8 < uVar5) {
        uVar8 = uVar5;
      }
      do {
        uVar5 = uVar8;
        uVar8 = uVar5 * 2;
      } while (uVar5 < count);
      if (uVar5 < 9) {
        psVar6 = (spvc_reflected_resource *)&this->stack_storage;
      }
      else {
        psVar6 = (spvc_reflected_resource *)malloc(uVar5 * 0x18);
      }
      if (psVar6 == (spvc_reflected_resource *)0x0) goto LAB_001cfdce;
      if ((psVar6 != (this->super_VectorView<spvc_reflected_resource>).ptr) &&
         ((this->super_VectorView<spvc_reflected_resource>).buffer_size != 0)) {
        lVar7 = 0;
        uVar8 = 0;
        do {
          psVar3 = (this->super_VectorView<spvc_reflected_resource>).ptr;
          *(undefined8 *)((long)&psVar6->name + lVar7) =
               *(undefined8 *)((long)&psVar3->name + lVar7);
          puVar1 = (undefined8 *)((long)&psVar3->id + lVar7);
          uVar4 = puVar1[1];
          pcVar2 = (char *)((long)&psVar6->id + lVar7);
          *(undefined8 *)pcVar2 = *puVar1;
          *(undefined8 *)(pcVar2 + 8) = uVar4;
          uVar8 = uVar8 + 1;
          lVar7 = lVar7 + 0x18;
        } while (uVar8 < (this->super_VectorView<spvc_reflected_resource>).buffer_size);
      }
      psVar3 = (this->super_VectorView<spvc_reflected_resource>).ptr;
      if (psVar3 != (spvc_reflected_resource *)&this->stack_storage) {
        free(psVar3);
      }
      (this->super_VectorView<spvc_reflected_resource>).ptr = psVar6;
      this->buffer_capacity = uVar5;
    }
    return;
  }
LAB_001cfdce:
  ::std::terminate();
}

Assistant:

void reserve(size_t count) SPIRV_CROSS_NOEXCEPT
	{
		if ((count > (std::numeric_limits<size_t>::max)() / sizeof(T)) ||
		    (count > (std::numeric_limits<size_t>::max)() / 2))
		{
			// Only way this should ever happen is with garbage input, terminate.
			std::terminate();
		}

		if (count > buffer_capacity)
		{
			size_t target_capacity = buffer_capacity;
			if (target_capacity == 0)
				target_capacity = 1;

			// Weird parens works around macro issues on Windows if NOMINMAX is not used.
			target_capacity = (std::max)(target_capacity, N);

			// Need to ensure there is a POT value of target capacity which is larger than count,
			// otherwise this will overflow.
			while (target_capacity < count)
				target_capacity <<= 1u;

			T *new_buffer =
			    target_capacity > N ? static_cast<T *>(malloc(target_capacity * sizeof(T))) : stack_storage.data();

			// If we actually fail this malloc, we are hosed anyways, there is no reason to attempt recovery.
			if (!new_buffer)
				std::terminate();

			// In case for some reason two allocations both come from same stack.
			if (new_buffer != this->ptr)
			{
				// We don't deal with types which can throw in move constructor.
				for (size_t i = 0; i < this->buffer_size; i++)
				{
					new (&new_buffer[i]) T(std::move(this->ptr[i]));
					this->ptr[i].~T();
				}
			}

			if (this->ptr != stack_storage.data())
				free(this->ptr);
			this->ptr = new_buffer;
			buffer_capacity = target_capacity;
		}
	}